

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O1

int nghttp2_adjust_local_window_size
              (int32_t *param_1,int32_t *recv_window_size_ptr,int32_t *recv_reduction_ptr,
              int32_t *delta_ptr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = *delta_ptr;
  if (iVar1 < 1) {
    if (*param_1 + iVar1 < 0) {
      return -0x20c;
    }
    if (*recv_window_size_ptr < -0x80000000 - iVar1) {
      return -0x20c;
    }
    if (iVar1 + 0x7fffffff < *recv_reduction_ptr) {
      return -0x20c;
    }
    *param_1 = *param_1 + iVar1;
    *recv_window_size_ptr = *recv_window_size_ptr + *delta_ptr;
    *recv_reduction_ptr = *recv_reduction_ptr - *delta_ptr;
    *delta_ptr = 0;
  }
  else {
    iVar2 = *recv_window_size_ptr;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    iVar2 = iVar2 - iVar1;
    if (-1 < iVar2) {
      *recv_window_size_ptr = iVar2;
      return 0;
    }
    if (iVar2 + 0x7fffffff < *param_1) {
      return -0x20c;
    }
    *param_1 = *param_1 - iVar2;
    iVar1 = *recv_reduction_ptr;
    iVar3 = -iVar2;
    if (SBORROW4(iVar1,-iVar2) != iVar1 + iVar2 < 0) {
      iVar3 = iVar1;
    }
    *recv_reduction_ptr = iVar1 - iVar3;
    *recv_window_size_ptr = (*recv_window_size_ptr >> 0x1f & *recv_window_size_ptr) + iVar3;
    *delta_ptr = *delta_ptr - iVar3;
  }
  return 0;
}

Assistant:

int nghttp2_adjust_local_window_size(int32_t *local_window_size_ptr,
                                     int32_t *recv_window_size_ptr,
                                     int32_t *recv_reduction_ptr,
                                     int32_t *delta_ptr) {
  if (*delta_ptr > 0) {
    int32_t recv_reduction_delta;
    int32_t delta;
    int32_t new_recv_window_size =
        nghttp2_max(0, *recv_window_size_ptr) - *delta_ptr;

    if (new_recv_window_size >= 0) {
      *recv_window_size_ptr = new_recv_window_size;
      return 0;
    }

    delta = -new_recv_window_size;

    /* The delta size is strictly more than received bytes. Increase
       local_window_size by that difference |delta|. */
    if (*local_window_size_ptr > NGHTTP2_MAX_WINDOW_SIZE - delta) {
      return NGHTTP2_ERR_FLOW_CONTROL;
    }
    *local_window_size_ptr += delta;
    /* If there is recv_reduction due to earlier window_size
       reduction, we have to adjust it too. */
    recv_reduction_delta = nghttp2_min(*recv_reduction_ptr, delta);
    *recv_reduction_ptr -= recv_reduction_delta;
    if (*recv_window_size_ptr < 0) {
      *recv_window_size_ptr += recv_reduction_delta;
    } else {
      /* If *recv_window_size_ptr > 0, then those bytes are going to
         be returned to the remote peer (by WINDOW_UPDATE with the
         adjusted *delta_ptr), so it is effectively 0 now.  We set to
         *recv_reduction_delta, because caller does not take into
         account it in *delta_ptr. */
      *recv_window_size_ptr = recv_reduction_delta;
    }
    /* recv_reduction_delta must be paid from *delta_ptr, since it was
       added in window size reduction (see below). */
    *delta_ptr -= recv_reduction_delta;

    return 0;
  }

  if (*local_window_size_ptr + *delta_ptr < 0 ||
      *recv_window_size_ptr < INT32_MIN - *delta_ptr ||
      *recv_reduction_ptr > INT32_MAX + *delta_ptr) {
    return NGHTTP2_ERR_FLOW_CONTROL;
  }
  /* Decreasing local window size. Note that we achieve this without
     noticing to the remote peer. To do this, we cut
     recv_window_size by -delta. This means that we don't send
     WINDOW_UPDATE for -delta bytes. */
  *local_window_size_ptr += *delta_ptr;
  *recv_window_size_ptr += *delta_ptr;
  *recv_reduction_ptr -= *delta_ptr;
  *delta_ptr = 0;

  return 0;
}